

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint32_t google::protobuf::internal::ReadSize(char **pp)

{
  byte *p_00;
  pair<const_char_*,_int> pVar1;
  pair<const_char_*,_int> x;
  uint32_t res;
  char *p;
  char **pp_local;
  
  p_00 = (byte *)*pp;
  pp_local._4_4_ = (uint)*p_00;
  if (pp_local._4_4_ < 0x80) {
    *pp = (char *)(p_00 + 1);
  }
  else {
    pVar1 = ReadSizeFallback((char *)p_00,pp_local._4_4_);
    pp_local._4_4_ = pVar1.second;
    *pp = pVar1.first;
  }
  return pp_local._4_4_;
}

Assistant:

inline uint32_t ReadSize(const char** pp) {
  auto p = *pp;
  uint32_t res = static_cast<uint8_t>(p[0]);
  if (res < 128) {
    *pp = p + 1;
    return res;
  }
  auto x = ReadSizeFallback(p, res);
  *pp = x.first;
  return x.second;
}